

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O3

void Diligent::
     LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [10],
               char **Args_1,char (*Args_2) [4],char (*Args_3) [54],uint *Args_4,char (*Args_5) [39]
               ,uint *Args_6,char (*Args_7) [34],uint *Args_8,char (*Args_9) [3])

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  char (*Args_9_00) [3];
  char local_71;
  string Msg;
  string FileName;
  
  std::__cxx11::string::string((string *)&FileName,FullFilePath,(allocator *)&Msg);
  Args_9_00 = (char (*) [3])0x2e4671;
  lVar1 = std::__cxx11::string::find_last_of((char *)&FileName,0x32e513,0xffffffffffffffff);
  if (lVar1 != -1) {
    Args_9_00 = (char (*) [3])0x2e4689;
    std::__cxx11::string::erase((ulong)&FileName,0);
  }
  FormatString<char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
            (&Msg,(Diligent *)Args,(char (*) [10])Args_1,(char **)Args_2,(char (*) [4])Args_3,
             (char (*) [54])Args_4,(uint *)Args_5,(char (*) [39])Args_6,(uint *)Args_7,
             (char (*) [34])Args_8,(uint *)Args_9,Args_9_00);
  if (DebugMessageCallback == (undefined *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Diligent Engine: ",0x11);
    pcVar4 = "Error";
    if (IsFatal) {
      pcVar4 = "Fatal Error";
    }
    lVar1 = 5;
    if (IsFatal) {
      lVar1 = 0xb;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    if (Function == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x436550);
    }
    else {
      sVar2 = strlen(Function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,Function,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"() (",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,FileName._M_dataplus._M_p,FileName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,Line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,Msg._M_dataplus._M_p,Msg._M_string_length);
    local_71 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_71,1);
  }
  else {
    (*(code *)DebugMessageCallback)
              (IsFatal | 2,Msg._M_dataplus._M_p,Function,FileName._M_dataplus._M_p,Line);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Msg._M_dataplus._M_p != &Msg.field_2) {
    operator_delete(Msg._M_dataplus._M_p,Msg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FileName._M_dataplus._M_p != &FileName.field_2) {
    operator_delete(FileName._M_dataplus._M_p,FileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}